

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_generated.h
# Opt level: O3

bool MyGame::Example::VerifyAnyUniqueAliases(Verifier *verifier,void *obj,AnyUniqueAliases type)

{
  bool bVar1;
  bool bVar2;
  undefined3 in_register_00000011;
  int iVar3;
  
  iVar3 = CONCAT31(in_register_00000011,type);
  bVar1 = true;
  if (iVar3 == 3) {
    if (obj != (void *)0x0) {
      bVar2 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)obj);
      if (bVar2) {
        verifier->depth_ = verifier->depth_ - 1;
      }
      else {
        bVar1 = false;
      }
    }
  }
  else if (iVar3 == 2) {
    if (obj != (void *)0x0) {
      bVar1 = TestSimpleTableWithEnum::Verify((TestSimpleTableWithEnum *)obj,verifier);
      return bVar1;
    }
  }
  else if ((iVar3 == 1) && (obj != (void *)0x0)) {
    bVar1 = Monster::Verify((Monster *)obj,verifier);
    return bVar1;
  }
  return bVar1;
}

Assistant:

inline bool VerifyAnyUniqueAliases(::flatbuffers::Verifier &verifier, const void *obj, AnyUniqueAliases type) {
  switch (type) {
    case AnyUniqueAliases_NONE: {
      return true;
    }
    case AnyUniqueAliases_M: {
      auto ptr = reinterpret_cast<const MyGame::Example::Monster *>(obj);
      return verifier.VerifyTable(ptr);
    }
    case AnyUniqueAliases_TS: {
      auto ptr = reinterpret_cast<const MyGame::Example::TestSimpleTableWithEnum *>(obj);
      return verifier.VerifyTable(ptr);
    }
    case AnyUniqueAliases_M2: {
      auto ptr = reinterpret_cast<const MyGame::Example2::Monster *>(obj);
      return verifier.VerifyTable(ptr);
    }
    default: return true;
  }
}